

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O3

bool __thiscall CDBWrapper::ExistsImpl(CDBWrapper *this,Span<const_std::byte> key)

{
  char cVar1;
  DB *pDVar2;
  unique_ptr<LevelDBContext,_std::default_delete<LevelDBContext>_> *puVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  Status status;
  Slice slKey;
  string strValue;
  Status in_stack_ffffffffffffff80;
  string local_68;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  long local_28;
  
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)key.m_data;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = 0;
  local_38 = 0;
  local_48 = &local_38;
  puVar3 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  pDVar2 = ((puVar3->_M_t).
            super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
            super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
            super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->pdb;
  puVar3 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  (*pDVar2->_vptr_DB[5])
            (&stack0xffffffffffffff80,pDVar2,
             &((puVar3->_M_t).
               super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
               super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
               super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->readoptions,
             &stack0xffffffffffffff88,&local_48);
  bVar4 = true;
  if (in_stack_ffffffffffffff80.state_ != (char *)0x0) {
    cVar1 = in_stack_ffffffffffffff80.state_[4];
    if (cVar1 != '\x01') {
      leveldb::Status::ToString_abi_cxx11_(&local_68,(Status *)&stack0xffffffffffffff80);
      logging_function._M_str = "ExistsImpl";
      logging_function._M_len = 10;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
      source_file._M_len = 0x56;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function,source_file,0x169,
                 IPC|COINDB|REINDEX|ADDRMAN|ESTIMATEFEE|WALLETDB|ZMQ|HTTP|TOR,(Level)&local_68,
                 in_stack_ffffffffffffff80.state_,args);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      HandleError((Status *)&stack0xffffffffffffff80);
      if (in_stack_ffffffffffffff80.state_ == (char *)0x0) goto LAB_0046530c;
    }
    operator_delete__(in_stack_ffffffffffffff80.state_);
    bVar4 = cVar1 != '\x01';
  }
LAB_0046530c:
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool CDBWrapper::ExistsImpl(Span<const std::byte> key) const
{
    leveldb::Slice slKey(CharCast(key.data()), key.size());

    std::string strValue;
    leveldb::Status status = DBContext().pdb->Get(DBContext().readoptions, slKey, &strValue);
    if (!status.ok()) {
        if (status.IsNotFound())
            return false;
        LogPrintf("LevelDB read failure: %s\n", status.ToString());
        HandleError(status);
    }
    return true;
}